

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::toString(String *__return_storage_ptr__,Approx *in)

{
  String local_88;
  String local_60;
  String local_48;
  String local_30;
  Approx *local_18;
  Approx *in_local;
  
  local_18 = in;
  in_local = (Approx *)__return_storage_ptr__;
  String::String(&local_48,"Approx( ");
  toString(&local_60,local_18->m_value);
  operator+(&local_30,&local_48,&local_60);
  String::String(&local_88," )");
  operator+(__return_storage_ptr__,&local_30,&local_88);
  String::~String(&local_88);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String toString(const Approx& in) {
    return "Approx( " + doctest::toString(in.m_value) + " )";
}